

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.cpp
# Opt level: O3

void dumpBytecodeAst_callback(HSQUIRRELVM vm,HSQOBJECT obj,void *opts)

{
  FileOutputStream fos;
  FileOutputStream local_40;
  
  if ((opts != (void *)0x0) && (*(char *)((long)opts + 1) == '\x01')) {
    if (*(char **)((long)opts + 0x10) == (char *)0x0) {
      local_40.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR_writeByte_001a23a8;
      local_40.file = _stdout;
      local_40.close = false;
      sq_dumpbytecode(vm,obj,&local_40.super_OutputStream);
    }
    else {
      FileOutputStream::FileOutputStream(&local_40,*(char **)((long)opts + 0x10));
      if (local_40.file == (FILE *)0x0) {
        printf("Error: cannot open Bytecode dump file \'%s\'\n",*(undefined8 *)((long)opts + 0x10));
      }
      else {
        sq_dumpbytecode(vm,obj,&local_40.super_OutputStream);
      }
    }
    FileOutputStream::~FileOutputStream(&local_40);
  }
  return;
}

Assistant:

static void dumpBytecodeAst_callback(HSQUIRRELVM vm, HSQOBJECT obj, void *opts)
{
    if (opts == NULL)
      return;
    DumpOptions *dumpOpt = (DumpOptions *)opts;
    if (dumpOpt->bytecodeDump)
    {
        if (dumpOpt->bytecodeDumpFileName)
        {
            FileOutputStream fos(dumpOpt->bytecodeDumpFileName);
            if (fos.valid())
            {
                sq_dumpbytecode(vm, obj, &fos);
            }
            else
            {
                printf(_SC("Error: cannot open Bytecode dump file '%s'\n"), dumpOpt->bytecodeDumpFileName);
            }
        }
        else
        {
            FileOutputStream fos(stdout);
            sq_dumpbytecode(vm, obj, &fos);
        }
    }
}